

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

size_t rtosc_scan_arg_vals(char *src,rtosc_arg_val_t *args,size_t n,char *buffer_for_strings,
                          size_t bufsize)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  ulong in_RDX;
  char *in_RDI;
  size_t scanned;
  size_t length;
  size_t tmp;
  size_t i;
  size_t rd;
  size_t last_bufsize;
  size_t in_stack_00000188;
  size_t *in_stack_00000190;
  char *in_stack_00000198;
  size_t in_stack_000001a0;
  rtosc_arg_val_t *in_stack_000001a8;
  char *in_stack_000001b0;
  int in_stack_000001c0;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff9c;
  rtosc_arg_val_t *in_stack_ffffffffffffffa0;
  ulong local_40;
  size_t local_38;
  char *local_8;
  
  local_38 = 0;
  local_40 = 0;
  local_8 = in_RDI;
  while (local_40 < in_RDX) {
    uVar4 = 1;
    sVar2 = rtosc_scan_arg_val(in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
                               in_stack_00000198,in_stack_00000190,in_stack_00000188,
                               in_stack_000001c0);
    local_8 = local_8 + sVar2;
    local_38 = sVar2 + local_38;
    iVar1 = next_arg_offset(in_stack_ffffffffffffffa0);
    local_40 = (long)iVar1 + local_40;
    do {
      iVar1 = skip_fmt((char **)in_stack_ffffffffffffffa0,
                       (char *)CONCAT44(in_stack_ffffffffffffff9c,uVar4));
      local_38 = (long)iVar1 + local_38;
      while (*local_8 == '%') {
        iVar1 = skip_fmt((char **)in_stack_ffffffffffffffa0,
                         (char *)CONCAT44(in_stack_ffffffffffffff9c,uVar4));
        local_38 = (long)iVar1 + local_38;
      }
      ppuVar3 = __ctype_b_loc();
    } while (((*ppuVar3)[(int)*local_8] & 0x2000) != 0);
  }
  return local_38;
}

Assistant:

size_t rtosc_scan_arg_vals(const char* src,
                           rtosc_arg_val_t *args, size_t n,
                           char* buffer_for_strings, size_t bufsize)
{
    size_t last_bufsize;
    size_t rd=0;
    for(size_t i = 0; i < n; )
    {
        last_bufsize = bufsize;

        size_t tmp = rtosc_scan_arg_val(src, args, n-i,
                                        buffer_for_strings, &bufsize, i, 1);
        src += tmp;
        rd += tmp;
        size_t length = next_arg_offset(args);
        i += length;
        args += length;

        size_t scanned = last_bufsize - bufsize;
        buffer_for_strings += scanned;

        do
        {
            rd += skip_fmt(&src, " %n");
            while(*src == '%')
                rd += skip_fmt(&src, "%*[^\n]%n");
        } while(isspace(*src));
    }
    return rd;
}